

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index_region.h
# Opt level: O3

bool __thiscall
S2ShapeIndexRegion<MutableS2ShapeIndex>::MayIntersect
          (S2ShapeIndexRegion<MutableS2ShapeIndex> *this,S2Cell *target)

{
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  Iterator *it;
  bool bVar1;
  CellRelation CVar2;
  const_reference clipped;
  size_type_conflict n;
  S2CellId local_50;
  S2Point local_48;
  
  CVar2 = MutableS2ShapeIndex::Iterator::Locate(this->iter_,(S2CellId)(target->id_).id_);
  if (CVar2 != DISJOINT) {
    if (CVar2 == SUBDIVIDED) {
      return true;
    }
    local_50.id_ = (this->iter_->super_IteratorBase).id_.id_;
    bVar1 = S2CellId::contains(&local_50,(S2CellId)(target->id_).id_);
    if (!bVar1) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_48,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_index_region.h"
                 ,0x128,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_48.c_[1],"Check failed: iter_.id().contains(target.id()) ",0x2f);
      abort();
    }
    if ((this->iter_->super_IteratorBase).id_.id_ == (target->id_).id_) {
      return true;
    }
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              (this->iter_->super_IteratorBase).cell_._M_b._M_p;
    n = 0;
    if ((*(uint *)&this_00->field_0x0 & 0xffffff) != 0) {
      do {
        clipped = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::
                  operator[](this_00,n);
        bVar1 = AnyEdgeIntersects(this,clipped,target);
        if (bVar1) {
          return true;
        }
        it = this->iter_;
        S2Cell::GetCenter(&local_48,target);
        bVar1 = S2ContainsPointQuery<MutableS2ShapeIndex>::ShapeContains
                          (&this->contains_query_,it,clipped,&local_48);
        if (bVar1) {
          return true;
        }
        n = n + 1;
      } while (n < (*(uint *)&this_00->field_0x0 & 0xffffff));
    }
  }
  return false;
}

Assistant:

bool S2ShapeIndexRegion<IndexType>::MayIntersect(const S2Cell& target) const {
  S2ShapeIndex::CellRelation relation = iter_.Locate(target.id());

  // If "target" does not overlap any index cell, there is no intersection.
  if (relation == S2ShapeIndex::DISJOINT) return false;

  // If "target" is subdivided into one or more index cells, then there is an
  // intersection to within the S2ShapeIndex error bound.
  if (relation == S2ShapeIndex::SUBDIVIDED) return true;

  // Otherwise, the iterator points to an index cell containing "target".
  //
  // If "target" is an index cell itself, there is an intersection because index
  // cells are created only if they have at least one edge or they are
  // entirely contained by the loop.
  S2_DCHECK(iter_.id().contains(target.id()));
  if (iter_.id() == target.id()) return true;

  // Test whether any shape intersects the target cell or contains its center.
  const S2ShapeIndexCell& cell = iter_.cell();
  for (int s = 0; s < cell.num_clipped(); ++s) {
    const S2ClippedShape& clipped = cell.clipped(s);
    if (AnyEdgeIntersects(clipped, target)) return true;
    if (contains_query_.ShapeContains(iter_, clipped, target.GetCenter())) {
      return true;
    }
  }
  return false;
}